

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

nh_bool find_race(nh_roles_info *ri,char *race_str,int *out_race)

{
  int iVar1;
  int local_2c;
  int i;
  int *out_race_local;
  char *race_str_local;
  nh_roles_info *ri_local;
  
  local_2c = 0;
  while( true ) {
    if (ri->num_races <= local_2c) {
      return '\0';
    }
    iVar1 = strcmp(race_str,ri->racenames[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *out_race = local_2c;
  return '\x01';
}

Assistant:

static nh_bool find_race(const struct nh_roles_info *ri,
			 const char *race_str, int *out_race)
{
    int i;

    for (i = 0; i < ri->num_races; i++) {
	if (!strcmp(race_str, ri->racenames[i])) {
	    *out_race = i;
	    return TRUE;
	}
    }
    return FALSE;
}